

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

float Search::action_cost_loss(action a,action *act,float *costs,size_t sz)

{
  ostream *this;
  undefined8 uVar1;
  ulong in_RCX;
  long in_RDX;
  long in_RSI;
  uint in_EDI;
  stringstream __msg;
  size_t i;
  string *in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe34;
  char *in_stack_fffffffffffffe38;
  vw_exception *in_stack_fffffffffffffe40;
  stringstream local_1b0 [16];
  ostream local_1a0;
  ulong local_28;
  uint local_8;
  float local_4;
  
  if (in_RSI == 0) {
    local_4 = *(float *)(in_RDX + (ulong)(in_EDI - 1) * 4);
  }
  else {
    local_28 = 0;
    while( true ) {
      if (in_RCX <= local_28) {
        local_8 = in_EDI;
        std::__cxx11::stringstream::stringstream(local_1b0);
        this = std::operator<<(&local_1a0,"action_cost_loss got action that wasn\'t allowed: ");
        std::ostream::operator<<(this,local_8);
        uVar1 = __cxa_allocate_exception(0x38);
        std::__cxx11::stringstream::str();
        VW::vw_exception::vw_exception
                  (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
                   in_stack_fffffffffffffe28);
        __cxa_throw(uVar1,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      if (*(uint *)(in_RSI + local_28 * 4) == in_EDI) break;
      local_28 = local_28 + 1;
    }
    local_4 = *(float *)(in_RDX + local_28 * 4);
  }
  return local_4;
}

Assistant:

float action_cost_loss(action a, const action* act, const float* costs, size_t sz)
{
  if (act == nullptr)
    return costs[a - 1];
  for (size_t i = 0; i < sz; i++)
    if (act[i] == a)
      return costs[i];
  THROW("action_cost_loss got action that wasn't allowed: " << a);
}